

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

int __thiscall glslang::TScanContext::dMat(TScanContext *this)

{
  int iVar1;
  TParseContextBase *pTVar2;
  
  this->afterType = true;
  pTVar2 = this->parseContext;
  iVar1 = (pTVar2->super_TParseVersions).version;
  if ((pTVar2->super_TParseVersions).profile == EEsProfile) {
    if (iVar1 < 300) goto LAB_0043c2f9;
    reservedWord(this);
  }
  else if (iVar1 < 400) {
    if (3 < (int)((ulong)((long)(pTVar2->symbolTable->table).
                                super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pTVar2->symbolTable->table).
                               super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
      if (0x95 < iVar1) {
        iVar1 = (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[8])
                          (pTVar2,"GL_ARB_gpu_shader_fp64");
        if ((char)iVar1 != '\0') goto LAB_0043c2b4;
        pTVar2 = this->parseContext;
        if (0x95 < (pTVar2->super_TParseVersions).version) {
          iVar1 = (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[8])
                            (pTVar2,"GL_ARB_vertex_attrib_64bit");
          pTVar2 = this->parseContext;
          if (((char)iVar1 != '\0') && ((pTVar2->super_TParseVersions).language == EShLangVertex))
          goto LAB_0043c2b4;
        }
      }
LAB_0043c2f9:
      if ((pTVar2->super_TParseVersions).forwardCompatible == true) {
        (*(pTVar2->super_TParseVersions)._vptr_TParseVersions[0x2e])
                  (pTVar2,&this->loc,"using future type keyword",this->tokenText,"");
      }
      iVar1 = identifierOrType(this);
      return iVar1;
    }
  }
LAB_0043c2b4:
  return this->keyword;
}

Assistant:

int TScanContext::dMat()
{
    afterType = true;

    if (parseContext.isEsProfile() && parseContext.version >= 300) {
        reservedWord();

        return keyword;
    }

    if (!parseContext.isEsProfile() && (parseContext.version >= 400 ||
        parseContext.symbolTable.atBuiltInLevel() ||
        (parseContext.version >= 150 && parseContext.extensionTurnedOn(E_GL_ARB_gpu_shader_fp64)) ||
        (parseContext.version >= 150 && parseContext.extensionTurnedOn(E_GL_ARB_vertex_attrib_64bit)
         && parseContext.language == EShLangVertex)))
        return keyword;

    if (parseContext.isForwardCompatible())
        parseContext.warn(loc, "using future type keyword", tokenText, "");

    return identifierOrType();
}